

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rand_kernel_1.h
# Opt level: O0

void __thiscall dlib::rand::set_seed(rand *this,string *value)

{
  long lVar1;
  ulong uVar2;
  char *pcVar3;
  string *in_RSI;
  long in_RDI;
  int i_1;
  size_type i;
  uint32 s;
  undefined4 in_stack_ffffffffffffffc0;
  int in_stack_ffffffffffffffc4;
  undefined4 local_24;
  undefined8 local_20;
  undefined4 local_14;
  
  std::__cxx11::string::operator=((string *)(in_RDI + 0x1390),in_RSI);
  lVar1 = std::__cxx11::string::size();
  if (lVar1 == 0) {
    random_helpers::
    mersenne_twister<unsigned_int,_32,_624,_397,_31,_2567483615U,_11,_7,_2636928640U,_15,_4022730752U,_18,_3346425566U>
    ::seed((mersenne_twister<unsigned_int,_32,_624,_397,_31,_2567483615U,_11,_7,_2636928640U,_15,_4022730752U,_18,_3346425566U>
            *)0x1521a7);
  }
  else {
    local_14 = 0;
    local_20 = 0;
    while( true ) {
      uVar2 = std::__cxx11::string::size();
      if (uVar2 <= local_20) break;
      in_stack_ffffffffffffffc4 = local_14 * 0x25;
      pcVar3 = (char *)std::__cxx11::string::operator[](in_RDI + 0x1390);
      local_14 = in_stack_ffffffffffffffc4 + *pcVar3;
      local_20 = local_20 + 1;
    }
    random_helpers::
    mersenne_twister<unsigned_int,_32,_624,_397,_31,_2567483615U,_11,_7,_2636928640U,_15,_4022730752U,_18,_3346425566U>
    ::seed((mersenne_twister<unsigned_int,_32,_624,_397,_31,_2567483615U,_11,_7,_2636928640U,_15,_4022730752U,_18,_3346425566U>
            *)(in_RDI + 8),local_14);
  }
  for (local_24 = 0; local_24 < 10000; local_24 = local_24 + 1) {
    random_helpers::
    mersenne_twister<unsigned_int,_32,_624,_397,_31,_2567483615U,_11,_7,_2636928640U,_15,_4022730752U,_18,_3346425566U>
    ::operator()((mersenne_twister<unsigned_int,_32,_624,_397,_31,_2567483615U,_11,_7,_2636928640U,_15,_4022730752U,_18,_3346425566U>
                  *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
  }
  *(undefined1 *)(in_RDI + 0x13b8) = 0;
  *(undefined8 *)(in_RDI + 0x13c0) = 0;
  return;
}

Assistant:

void set_seed (
                const std::string& value
            )
            {
                seed = value;

                // make sure we do the seeding so that using a seed of "" gives the same
                // state as calling this->clear()
                if (value.size() != 0)
                {
                    uint32 s = 0;
                    for (std::string::size_type i = 0; i < seed.size(); ++i)
                    {
                        s = (s*37) + static_cast<uint32>(seed[i]);
                    }
                    mt.seed(s);
                }
                else
                {
                    mt.seed();
                }

                // prime the generator a bit
                for (int i = 0; i < 10000; ++i)
                    mt();


                has_gaussian = false;
                next_gaussian = 0;
            }